

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[25],unsigned_short_const&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [25],unsigned_short *params_1,
          char (*params_2) [2])

{
  CappedArray<char,_8UL> local_50;
  CappedArray<char,_8UL> local_40;
  ArrayPtr<const_char> local_30;
  
  local_30 = toCharSequence<char_const(&)[25]>((char (*) [25])this);
  local_40 = toCharSequence<unsigned_short_const&>((unsigned_short *)params);
  local_50 = (CappedArray<char,_8UL>)toCharSequence<char_const(&)[2]>((char (*) [2])params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&local_40,&local_50,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}